

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_profiling.cpp
# Opt level: O3

void TraverseTree(duckdb_profiling_info profiling_info,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *cumulative_counter,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *cumulative_result,idx_t depth)

{
  ulong uVar1;
  duckdb_profiling_info profiling_info_00;
  idx_t child_count;
  AssertionHandler catchAssertionHandler;
  ulong local_d8;
  undefined4 local_cc;
  SourceLineInfo local_c8;
  StringRef local_b8;
  AssertionHandler local_a8;
  ITransientExpression local_60;
  undefined1 *local_50;
  char *local_48;
  size_t sStack_40;
  undefined4 *local_38;
  
  RetrieveMetrics(profiling_info,cumulative_counter,cumulative_result,depth);
  uVar1 = duckdb_profiling_info_get_child_count(profiling_info);
  local_d8 = uVar1;
  if (depth == 0) {
    local_60._vptr_ITransientExpression = (_func_int **)0x4aafe1;
    local_60.m_isBinaryExpression = true;
    local_60.m_result = false;
    local_60._10_6_ = 0;
    local_c8.file =
         "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_profiling.cpp"
    ;
    local_c8.line = 0x5f;
    Catch::StringRef::StringRef(&local_b8,"child_count != 0");
    Catch::AssertionHandler::AssertionHandler
              (&local_a8,(StringRef *)&local_60,&local_c8,local_b8,Normal);
    local_cc = 0;
    Catch::StringRef::StringRef((StringRef *)&local_c8,"!=");
    local_60.m_result = uVar1 != 0;
    local_60.m_isBinaryExpression = true;
    local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005c88d8;
    local_48 = local_c8.file;
    sStack_40 = local_c8.line;
    local_38 = &local_cc;
    local_50 = (undefined1 *)&local_d8;
    Catch::AssertionHandler::handleExpr(&local_a8,&local_60);
    Catch::ITransientExpression::~ITransientExpression(&local_60);
    Catch::AssertionHandler::complete(&local_a8);
    if (local_a8.m_completed == false) {
      (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0x11])();
    }
  }
  if (local_d8 != 0) {
    uVar1 = 0;
    do {
      profiling_info_00 =
           (duckdb_profiling_info)duckdb_profiling_info_get_child(profiling_info,uVar1);
      TraverseTree(profiling_info_00,cumulative_counter,cumulative_result,depth + 1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_d8);
  }
  return;
}

Assistant:

void TraverseTree(duckdb_profiling_info profiling_info, duckdb::map<string, double> &cumulative_counter,
                  duckdb::map<string, double> &cumulative_result, const idx_t depth) {

	RetrieveMetrics(profiling_info, cumulative_counter, cumulative_result, depth);

	// Recurse into the child node.
	auto child_count = duckdb_profiling_info_get_child_count(profiling_info);
	if (depth == 0) {
		REQUIRE(child_count != 0);
	}

	for (idx_t i = 0; i < child_count; i++) {
		auto child = duckdb_profiling_info_get_child(profiling_info, i);
		TraverseTree(child, cumulative_counter, cumulative_result, depth + 1);
	}
}